

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eternal.hpp
# Opt level: O2

element<unsigned_int,_mapbox::eternal::string> *
mapbox::eternal::impl::
bound<mapbox::eternal::impl::less,mapbox::eternal::impl::element<unsigned_int,mapbox::eternal::string>const*,mapbox::eternal::impl::compare_key<unsigned_int>>
          (element<unsigned_int,_mapbox::eternal::string> *left,
          element<unsigned_int,_mapbox::eternal::string> *right,compare_key<unsigned_int> *key)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (long)right - (long)left >> 4;
  while (uVar2 = uVar1, uVar2 != 0) {
    uVar1 = uVar2 >> 1;
    if (left[uVar1].pair.first < key->key) {
      left = left + uVar1 + 1;
      uVar1 = ~uVar1 + uVar2;
    }
  }
  return left;
}

Assistant:

MAPBOX_ETERNAL_CONSTEXPR auto bound(Iterator left, Iterator right, const Key& key) noexcept {
    std::size_t count = std::size_t(right - left);
    while (count > 0) {
        const std::size_t step = count / 2;
        right = left + step;
        if (Compare()(*right, key)) {
            left = ++right;
            count -= step + 1;
        } else {
            count = step;
        }
    }
    return left;
}